

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O3

void test_ADynArray_appendArray_success_notEnoughCapacity_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char **ppcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *pcStack_68;
  char *pcStack_60;
  char *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  code *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  
  local_48 = private_ACUtilsTest_ADynArray_realloc;
  pcStack_40 = private_ACUtilsTest_ADynArray_free;
  local_30 = (char *)0x5;
  local_38 = private_ACUtilsTest_ADynArray_growStrategy;
  local_28 = (char *)0x5;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_50 = 0x114bc6;
  local_20 = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,5);
  builtin_strncpy(local_20,"01234",5);
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  uStack_50 = 0x114c00;
  bVar1 = private_ACUtils_ADynArray_insertArray(&local_48,0xffffffffffffffff,"56",3,1);
  if (bVar1 == true) {
    uStack_50 = 0x114c1a;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x546);
    if (local_30 == (char *)0x8) {
      uStack_50 = 0x114c3a;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x547);
      if (local_28 == (char *)0x8) {
        uStack_50 = 0x114c5a;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x548);
        if (local_20 == (char *)0x0) {
          pcVar6 = "(void*) array.buffer != NULL";
          pcVar7 = "(void*) array.buffer";
          iVar2 = 0x549;
LAB_00114e71:
          uStack_50 = 0;
          local_58 = (char *)0x0;
          pcStack_60 = (char *)0x114e78;
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,iVar2,"Assertion \'_ck_x != NULL\' failed",
                            "Assertion \'%s\' failed: %s == %#x",pcVar6,pcVar7);
        }
        uStack_50 = 0x114c77;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x549);
        pcVar4 = local_20;
        if (local_20 == (char *)0x0) {
          pcVar6 = "";
          pcVar4 = "(null)";
        }
        else {
          uStack_50 = 0x114c94;
          iVar2 = strcmp("0123456",local_20);
          if (iVar2 == 0) {
            uStack_50 = 0x114cad;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x54a);
            if (local_38 == (code *)0x0) {
              pcVar6 = "(void*) array.growStrategy != NULL";
              pcVar7 = "(void*) array.growStrategy";
              iVar2 = 0x54b;
              goto LAB_00114e71;
            }
            uStack_50 = 0x114cca;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x54b);
            if (private_ACUtilsTest_ADynArray_reallocCount == 1) {
              uStack_50 = 0x114cec;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x54c);
              uStack_50 = 0x114cf5;
              (*pcStack_40)(local_20);
              return;
            }
            pcStack_60 = "1";
            pcVar7 = "private_ACUtilsTest_ADynArray_reallocCount == 1";
            pcVar8 = "private_ACUtilsTest_ADynArray_reallocCount";
            iVar2 = 0x54c;
            pcVar6 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
            goto LAB_00114ea7;
          }
          pcVar6 = "\"";
        }
        expr = 
        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
        ;
        pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
        pcVar7 = "array.buffer == \"0123456\"";
        pcVar8 = "array.buffer";
        iVar2 = 0x54a;
        local_58 = "\"";
        pcStack_60 = "0123456";
        pcStack_68 = "\"";
        pcStack_70 = "\"0123456\"";
        ppcVar5 = &pcStack_80;
        pcStack_80 = pcVar4;
        pcStack_78 = pcVar6;
        goto LAB_00114eaf;
      }
      pcVar7 = "array.capacity == 8";
      pcVar8 = "array.capacity";
      iVar2 = 0x548;
      pcVar6 = local_28;
    }
    else {
      pcVar7 = "array.size == 8";
      pcVar8 = "array.size";
      iVar2 = 0x547;
      pcVar6 = local_30;
    }
    pcStack_60 = "8";
    local_58 = (char *)0x8;
  }
  else {
    pcVar6 = (char *)(ulong)bVar1;
    pcStack_60 = "true";
    pcVar7 = 
    "private_ACUtils_ADynArray_insertArray(&array, -1, \"56\\0\", 3, sizeof(*(&array)->buffer)) == true"
    ;
    pcVar8 = 
    "private_ACUtils_ADynArray_insertArray(&array, -1, \"56\\0\", 3, sizeof(*(&array)->buffer))";
    iVar2 = 0x546;
LAB_00114ea7:
    local_58 = (char *)0x1;
  }
  expr = "Assertion \'_ck_x == _ck_y\' failed";
  pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  ppcVar5 = &pcStack_60;
LAB_00114eaf:
  uStack_50 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar6;
  *(code **)((long)ppcVar5 + -0x10) = test_ADynArray_appendArray_success_nullptrArray_fn;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,expr,pcVar3,pcVar7,pcVar8);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_appendArray_success_notEnoughCapacity)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = 5;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = 5;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    memcpy(array.buffer, "01234", 5);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_appendArray(&array, "56\0", 3), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 8);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "0123456");
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 1);
    array.deallocator(array.buffer);
}